

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderLocatorBaseURI(xmlTextReaderLocatorPtr locator)

{
  long lVar1;
  xmlChar *pxVar2;
  xmlParserCtxtPtr ctx;
  
  if (locator == (xmlTextReaderLocatorPtr)0x0) {
    return (xmlChar *)0x0;
  }
  if (*(xmlNode **)((long)locator + 0x50) == (xmlNode *)0x0) {
    pxVar2 = *(xmlChar **)(*(long *)((long)locator + 0x38) + 8);
    if (pxVar2 == (xmlChar *)0x0) {
      if ((long)*(int *)((long)locator + 0x40) < 2) {
        pxVar2 = (xmlChar *)0x0;
      }
      else {
        lVar1 = *(long *)(*(long *)((long)locator + 0x48) + -0x10 +
                         (long)*(int *)((long)locator + 0x40) * 8);
        if (lVar1 == 0) {
          return (xmlChar *)0x0;
        }
        pxVar2 = *(xmlChar **)(lVar1 + 8);
      }
    }
    pxVar2 = xmlStrdup(pxVar2);
    return pxVar2;
  }
  pxVar2 = xmlNodeGetBase((xmlDoc *)0x0,*(xmlNode **)((long)locator + 0x50));
  return pxVar2;
}

Assistant:

xmlChar *
xmlTextReaderLocatorBaseURI(xmlTextReaderLocatorPtr locator) {
    /* we know that locator is a xmlParserCtxtPtr */
    xmlParserCtxtPtr ctx = (xmlParserCtxtPtr)locator;
    xmlChar *ret = NULL;

    if (locator == NULL)
        return(NULL);
    if (ctx->node != NULL) {
	ret = xmlNodeGetBase(NULL,ctx->node);
    }
    else {
	/* inspired from error.c */
	xmlParserInputPtr input;
	input = ctx->input;
	if ((input->filename == NULL) && (ctx->inputNr > 1))
	    input = ctx->inputTab[ctx->inputNr - 2];
	if (input != NULL) {
	    ret = xmlStrdup(BAD_CAST input->filename);
	}
	else {
	    ret = NULL;
	}
    }

    return ret;
}